

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSON.cc
# Opt level: O2

JSON * __thiscall phosg::JSON::at(JSON *this,size_t index)

{
  pointer puVar1;
  list_type *plVar2;
  out_of_range *this_00;
  
  plVar2 = as_list(this);
  puVar1 = (plVar2->
           super__Vector_base<std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>,_std::allocator<std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if (index < (ulong)((long)(plVar2->
                            super__Vector_base<std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>,_std::allocator<std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish - (long)puVar1 >> 3)) {
    return (JSON *)((_Tuple_impl<0UL,_phosg::JSON_*,_std::default_delete<phosg::JSON>_>)
                   puVar1[index]._M_t.
                   super___uniq_ptr_impl<phosg::JSON,_std::default_delete<phosg::JSON>_>._M_t).
                   super__Tuple_impl<0UL,_phosg::JSON_*,_std::default_delete<phosg::JSON>_>;
  }
  this_00 = (out_of_range *)__cxa_allocate_exception(0x10);
  ::std::out_of_range::out_of_range(this_00,"JSON array index out of bounds");
  __cxa_throw(this_00,&::std::out_of_range::typeinfo,::std::out_of_range::~out_of_range);
}

Assistant:

JSON& JSON::at(size_t index) {
  auto& list = this->as_list();
  if (index >= list.size()) {
    throw out_of_range("JSON array index out of bounds");
  }
  return *list[index];
}